

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O3

_Bool observe_kill_move(wchar_t y,wchar_t x,wchar_t d,uint8_t a,wchar_t c,_Bool flag)

{
  ushort uVar1;
  short sVar2;
  wchar_t x_00;
  wchar_t y_00;
  int iVar3;
  int iVar4;
  bool bVar5;
  chunk_conflict *c_00;
  monster_race *pmVar6;
  borg_kill *pbVar7;
  int16_t iVar8;
  _Bool _Var9;
  wchar_t wVar10;
  uint uVar11;
  loc grid;
  monster *pmVar12;
  char *pcVar13;
  wchar_t y_01;
  _Bool multi;
  long lVar14;
  bitflag *flags;
  wchar_t x_01;
  long lVar15;
  uint8_t *puVar16;
  wchar_t local_5c;
  
  if (1 < borg_kills_nxt) {
    lVar14 = 1;
    lVar15 = 0x1d8;
    local_5c = d;
    do {
      pbVar7 = borg_kills;
      if ((*(short *)(borg_kills->spell + lVar15 + -0x19) != 0) &&
         (borg_kills->spell[lVar15 + -0x10] == '\0')) {
        x_00 = *(wchar_t *)(borg_kills->spell + lVar15 + -0xd);
        y_00 = *(wchar_t *)(borg_kills->spell + lVar15 + -9);
        wVar10 = borg_distance(y_00,x_00,y,x);
        pmVar6 = r_info;
        uVar1 = *(ushort *)(pbVar7->spell + lVar15 + -0x19);
        flags = r_info[uVar1].flags;
        _Var9 = flag_has_dbg(flags,0xb,1,"r_ptr->flags","RF_UNIQUE");
        c_00 = cave;
        local_5c = local_5c << _Var9;
        if (wVar10 <= local_5c) {
          sVar2 = *(short *)((long)&pbVar7->m_idx + lVar15);
          grid = (loc)loc(x,y);
          pmVar12 = square_monster(c_00,grid);
          if ((pmVar12->midx == (int)sVar2) &&
             ((flag || (wVar10 <= (int)(uint)(byte)(pbVar7->spell[lVar15 + -2] / 10 + 1))))) {
            if (borg.trait[0x78] != 0) {
LAB_00218a6b:
              _Var9 = flag_has_dbg(flags,0xb,10,"r_ptr->flags","RF_ATTR_MULTI");
              if (_Var9) {
LAB_00218b6f:
                puVar16 = pbVar7->spell + lVar15 + -9;
                bVar5 = false;
              }
              else {
                y_01 = L'\x0028440b';
                x_01 = L'\x0027d666';
                _Var9 = flag_has_dbg(flags,0xb,9,"r_ptr->flags","RF_ATTR_CLEAR");
                if (_Var9) goto LAB_00218b6f;
                if (((!flag) || (pbVar7->spell[lVar15 + -0x17] != '\0')) ||
                   (uVar11 = borg_guess_race((uint8_t)y,x,multi,y_01,x_01), uVar11 == 0))
                goto LAB_00218a03;
                pcVar13 = format("# Flickering monster \'%s\' at (%d,%d)",r_info[uVar11].name,
                                 (ulong)(uint)y,(ulong)(uint)x);
                borg_note(pcVar13);
                uVar1 = *(ushort *)(pbVar7->spell + lVar15 + -0x19);
                if (uVar1 == 0) {
                  pcVar13 = "dead monster";
                }
                else if ((int)(uint)uVar1 < (int)(z_info->r_max - 1)) {
                  pcVar13 = r_info[(uint)uVar1].name;
                }
                else {
                  pcVar13 = "player ghost";
                }
                puVar16 = pbVar7->spell + lVar15 + -9;
                pcVar13 = format("# Converting a monster \'%s\' at (%d,%d)",pcVar13,
                                 (ulong)*(uint *)puVar16,(ulong)*(uint *)(puVar16 + -4));
                borg_note(pcVar13);
                *(short *)(puVar16 + -0x10) = (short)uVar11;
                borg_danger_wipe = true;
                borg.goal.type = 0;
                bVar5 = true;
              }
              if (wVar10 != L'\0') {
                iVar3 = *(int *)(pbVar7->spell + lVar15 + -9);
                iVar4 = *(int *)(pbVar7->spell + lVar15 + -0xd);
                borg_grids[iVar3][iVar4].kill = '\0';
                pbVar7->spell[lVar15 + -5] = (uint8_t)iVar4;
                pbVar7->spell[lVar15 + -4] = (uint8_t)iVar3;
                *(wchar_t *)(pbVar7->spell + lVar15 + -0xd) = x;
                *(wchar_t *)(pbVar7->spell + lVar15 + -9) = y;
                borg_grids[y][x].kill = (uint8_t)lVar14;
                uVar1 = *(ushort *)(pbVar7->spell + lVar15 + -0x19);
                if (uVar1 == 0) {
                  pcVar13 = "dead monster";
                }
                else if ((int)(uint)uVar1 < (int)(z_info->r_max - 1)) {
                  pcVar13 = r_info[(uint)uVar1].name;
                }
                else {
                  pcVar13 = "player ghost";
                }
                pcVar13 = format("# Tracking a monster \'%s\' at (%d,%d) from (%d,%d)",pcVar13,
                                 (ulong)(uint)y,(ulong)(uint)x,(ulong)(uint)y_00,(ulong)(uint)x_00);
                borg_note(pcVar13);
                borg_danger_wipe = true;
                if (borg.goal.type == 1 && borg.trait[0x25] == 0) {
                  if ((*(uint *)puVar16 != (uint)borg_flow_y[0]) ||
                     (*(uint *)(pbVar7->spell + lVar15 + -0xd) != (uint)borg_flow_x[0]))
                  goto LAB_00218cb8;
                }
                else if ((borg.goal.type != 2) || (borg.munchkin_mode != true)) goto LAB_00218cb8;
                borg.goal.type = 0;
              }
LAB_00218cb8:
              iVar8 = borg_t;
              *(int16_t *)((long)&pbVar7->when + lVar15) = borg_t;
              if (borg_morgoth_id == *(ushort *)(pbVar7->spell + lVar15 + -0x19)) {
                borg_t_morgoth = iVar8;
              }
              if (bVar5) {
                borg_update_kill_new((wchar_t)lVar14);
              }
              borg_update_kill_old((wchar_t)lVar14);
              pbVar7->spell[lVar15 + -0x10] = '\x01';
              return true;
            }
            if (pmVar6[uVar1].d_char == c) {
              if (pmVar6[uVar1].d_attr != a) goto LAB_00218a6b;
              goto LAB_00218b6f;
            }
          }
        }
      }
LAB_00218a03:
      lVar14 = lVar14 + 1;
      lVar15 = lVar15 + 0x1d8;
    } while (lVar14 < borg_kills_nxt);
  }
  return false;
}

Assistant:

bool observe_kill_move(int y, int x, int d, uint8_t a, wchar_t c, bool flag)
{
    int                  i, z, ox, oy;
    unsigned int         r_idx;
    borg_kill           *kill;
    struct monster_race *r_ptr;

    bool flicker = false;

    /* Look at the monsters */
    for (i = 1; i < borg_kills_nxt; i++) {
        kill = &borg_kills[i];

        /* Skip dead monsters */
        if (!kill->r_idx)
            continue;

        /* Skip assigned monsters */
        if (kill->seen)
            continue;

        /* Old location */
        ox = kill->pos.x;
        oy = kill->pos.y;

        /* Calculate distance */
        z = borg_distance(oy, ox, y, x);

        /* Access the monster race */
        r_ptr = &r_info[kill->r_idx];

        /* Double the distance for uniques so the borg does not create 2 of the
         * same unique monster on the level */
        if (rf_has(r_ptr->flags, RF_UNIQUE))
            d = d * 2;

        /* Verify distance */
        if (z > d)
            continue;

        /* Verify that we are looking at the right one */
        if (kill->m_idx != square_monster(cave, loc(x, y))->midx)
            continue;

        /* Verify "reasonable" motion, if allowed */
        if (!flag && (z > (kill->moves / 10) + 1))
            continue;

        /* Verify matching char so long as not hallucinating */
        if (!borg.trait[BI_ISIMAGE] && c != r_ptr->d_char)
            continue;

        /* Verify matching attr so long as not hallucinating */
        if (a != r_ptr->d_attr || borg.trait[BI_ISIMAGE]) {
            /* Require matching attr (for normal monsters) */
            if (!rf_has(r_ptr->flags, RF_ATTR_MULTI)
                && !rf_has(r_ptr->flags, RF_ATTR_CLEAR)) {
                /* Require flag */
                if (!flag)
                    continue;

                /* Never flicker known monsters */
                if (kill->known)
                    continue;

                /* Find a multi-hued monster */
                r_idx = borg_guess_race(a, c, true, y, x);

                /* Handle failure */
                if (!r_idx)
                    continue;

                /* Note */
                borg_note(format("# Flickering monster '%s' at (%d,%d)",
                    (r_info[r_idx].name), y, x));

                /* Note */
                borg_note(format("# Converting a monster '%s' at (%d,%d)",
                    borg_race_name(kill->r_idx), kill->pos.y, kill->pos.x));

                /* Change the race */
                kill->r_idx = r_idx;

                /* Monster flickers */
                flicker = true;

                /* Recalculate danger */
                borg_danger_wipe = true;

                /* Clear monster flow goals */
                borg.goal.type = 0;
            }
        }

        /* Actual movement */
        if (z) {

            /* Update the grids */
            borg_grids[kill->pos.y][kill->pos.x].kill = 0;

            /* Save the old Location */
            kill->ox = kill->pos.x;
            kill->oy = kill->pos.y;

            /* Save the Location */
            kill->pos.x = x;
            kill->pos.y = y;

            /* Update the grids */
            borg_grids[kill->pos.y][kill->pos.x].kill = i;

            /* Note */
            borg_note(
                format("# Tracking a monster '%s' at (%d,%d) from (%d,%d)",
                    borg_race_name(kill->r_idx), kill->pos.y, kill->pos.x, oy, ox));

            /* Recalculate danger */
            borg_danger_wipe = true;

            /* Clear goals */
            if ((!borg.trait[BI_ESP] && borg.goal.type == GOAL_KILL
                    && (borg_flow_y[0] == kill->pos.y
                        && borg_flow_x[0] == kill->pos.x))
                || (borg.goal.type == GOAL_TAKE && borg.munchkin_mode))
                borg.goal.type = 0;
        }

        /* Note when last seen */
        kill->when = borg_t;

        /* Mark the Morgoth time stamp if needed */
        if (kill->r_idx == borg_morgoth_id)
            borg_t_morgoth = borg_t;

        /* Monster flickered */
        if (flicker) {
            /* Update the monster */
            borg_update_kill_new(i);
        }

        /* Update the monster */
        borg_update_kill_old(i);

        /* Mark as seen */
        kill->seen = true;

        /* Done */
        return true;
    }

    /* Oops */
    return false;
}